

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cpp
# Opt level: O3

void __thiscall Polymerase::Move(Polymerase *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  SpeciesTracker *pSVar4;
  
  iVar3 = std::__cxx11::string::compare((char *)&(this->super_MobileElement).name_);
  if (iVar3 == 0) {
    pSVar4 = SpeciesTracker::Instance();
    iVar3 = 3;
    if ((pSVar4->codon_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
    goto LAB_00114657;
  }
  iVar3 = 1;
LAB_00114657:
  uVar1 = (this->super_MobileElement).start_;
  uVar2 = (this->super_MobileElement).stop_;
  (this->super_MobileElement).start_ = iVar3 + uVar1;
  (this->super_MobileElement).stop_ = iVar3 + uVar2;
  return;
}

Assistant:

void Polymerase::Move() {

  if (name_ == "__ribosome" && !SpeciesTracker::Instance().codon_map().empty()) {
    start_ += 3;
    stop_ += 3;
  } else {
    start_++;
    stop_++;
  }
}